

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterquietus.cpp
# Opt level: O3

int AF_A_DropWeaponPieces(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  PClass *pPVar5;
  uint uVar6;
  PClass *pPVar7;
  AActor *pAVar8;
  PClassActor *pPVar9;
  PClassActor *pPVar10;
  int iVar11;
  PClassActor *pPVar12;
  char *pcVar13;
  undefined8 *puVar14;
  int iVar15;
  bool bVar16;
  PClassActor *local_70;
  DVector3 local_48;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar13 = "(paramnum) < numparam";
    goto LAB_005dcde6;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_005dcdbb:
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_005dcde6:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                  ,0x1d,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  puVar14 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar14 == (undefined8 *)0x0) goto LAB_005dcb32;
    pPVar7 = (PClass *)puVar14[1];
    if (pPVar7 == (PClass *)0x0) {
      pPVar7 = (PClass *)(**(code **)*puVar14)(puVar14);
      puVar14[1] = pPVar7;
    }
    bVar16 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar5 && bVar16) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar16 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar5) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar16) {
      pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005dcde6;
    }
  }
  else {
    if (puVar14 != (undefined8 *)0x0) goto LAB_005dcdbb;
LAB_005dcb32:
    puVar14 = (undefined8 *)0x0;
  }
  if (numparam == 1) {
    pcVar13 = "(paramnum) < numparam";
    goto LAB_005dce05;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_005dcdc4:
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_005dce05:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                  ,0x1e,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  local_70 = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (local_70 == (PClassActor *)0x0) goto LAB_005dcb9b;
    pPVar9 = local_70;
    if (local_70 != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar9 = (PClassActor *)(pPVar9->super_PClass).ParentClass;
        if (pPVar9 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar9 != (PClassActor *)0x0);
      if (pPVar9 == (PClassActor *)0x0) {
        pcVar13 = "p1 == NULL || p1->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_005dce05;
      }
    }
  }
  else {
    if (local_70 != (PClassActor *)0x0) goto LAB_005dcdc4;
LAB_005dcb9b:
    local_70 = (PClassActor *)0x0;
  }
  if (numparam < 3) {
    pcVar13 = "(paramnum) < numparam";
    goto LAB_005dce24;
  }
  if (param[2].field_0.field_3.Type != '\x03') {
LAB_005dcdcd:
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_005dce24:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                  ,0x1f,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  pPVar9 = (PClassActor *)param[2].field_0.field_1.a;
  if (param[2].field_0.field_1.atag == 1) {
    if (pPVar9 == (PClassActor *)0x0) goto LAB_005dcc08;
    pPVar12 = pPVar9;
    if (pPVar9 != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
        if (pPVar12 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar12 != (PClassActor *)0x0);
      if (pPVar12 == (PClassActor *)0x0) {
        pcVar13 = "p2 == NULL || p2->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_005dce24;
      }
    }
  }
  else {
    if (pPVar9 != (PClassActor *)0x0) goto LAB_005dcdcd;
LAB_005dcc08:
    pPVar9 = (PClassActor *)0x0;
  }
  if (numparam == 3) {
    pcVar13 = "(paramnum) < numparam";
  }
  else {
    if (param[3].field_0.field_3.Type == '\x03') {
      pPVar12 = (PClassActor *)param[3].field_0.field_1.a;
      if (param[3].field_0.field_1.atag == 1) {
        if (pPVar12 == (PClassActor *)0x0) {
          pPVar12 = (PClassActor *)0x0;
        }
        else {
          pPVar10 = pPVar12;
          if (pPVar12 != (PClassActor *)AActor::RegistrationInfo.MyClass) {
            do {
              pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
              if (pPVar10 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
            } while (pPVar10 != (PClassActor *)0x0);
            if (pPVar10 == (PClassActor *)0x0) {
              pcVar13 = "p3 == NULL || p3->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_005dce43;
            }
          }
        }
LAB_005dcc7e:
        iVar15 = 0;
        iVar11 = 0;
        do {
          pPVar10 = pPVar12;
          if (iVar11 == 1) {
            pPVar10 = pPVar9;
          }
          if (iVar11 == 0) {
            pPVar10 = local_70;
          }
          if (pPVar10 != (PClassActor *)0x0) {
            local_48.X = (double)puVar14[9];
            local_48.Y = (double)puVar14[10];
            local_48.Z = (double)puVar14[0xb];
            pAVar8 = AActor::StaticSpawn(pPVar10,&local_48,ALLOW_REPLACE,false);
            if (pAVar8 != (AActor *)0x0) {
              __x = FFastTrig::cos(&fasttrig,
                                   (double)iVar15 * 11930464.711111112 + 6755399441055744.0);
              dVar2 = FFastTrig::sin(&fasttrig,__x);
              (pAVar8->Vel).Z = (double)puVar14[0x17];
              dVar3 = (double)puVar14[0x15];
              dVar4 = (double)puVar14[0x16];
              pbVar1 = (byte *)((long)&(pAVar8->flags).Value + 2);
              *pbVar1 = *pbVar1 | 2;
              (pAVar8->Vel).X = __x + dVar3;
              (pAVar8->Vel).Y = dVar2 + dVar4;
              if (iVar11 == 0) {
                uVar6 = FRandom::GenRand32(&pr_quietusdrop);
                iVar11 = (uVar6 & 1) + 1;
              }
              else {
                iVar11 = 3 - iVar11;
              }
            }
          }
          iVar15 = iVar15 + 0x78;
        } while (iVar15 != 0x168);
        return 0;
      }
      if (pPVar12 == (PClassActor *)0x0) {
        pPVar12 = (PClassActor *)0x0;
        goto LAB_005dcc7e;
      }
    }
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005dce43:
  __assert_fail(pcVar13,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                ,0x20,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_DropWeaponPieces)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(p1, AActor);
	PARAM_CLASS(p2, AActor);
	PARAM_CLASS(p3, AActor);

	for (int i = 0, j = 0; i < 3; ++i)
	{
		PClassActor *cls = j == 0 ?  p1 : j == 1 ? p2 : p3;
		if (cls)
		{
			AActor *piece = Spawn (cls, self->Pos(), ALLOW_REPLACE);
			if (piece != NULL)
			{
				piece->Vel = self->Vel + DAngle(i*120.).ToVector(1);
				piece->flags |= MF_DROPPED;
				j = (j == 0) ? (pr_quietusdrop() & 1) + 1 : 3-j;
			}
		}
	}
	return 0;
}